

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

ArgumentMismatch *
CLI::ArgumentMismatch::TypedAtLeast
          (ArgumentMismatch *__return_storage_ptr__,string *name,int num,string *type)

{
  undefined8 *puVar1;
  pointer pcVar2;
  uint uVar3;
  undefined8 *puVar4;
  long *plVar5;
  uint uVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __val;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_f0 = local_e0;
  pcVar2 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + name->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_f0);
  __val = -num;
  if (0 < num) {
    __val = num;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0014b401;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0014b401;
      }
      if (uVar6 < 10000) goto LAB_0014b401;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_0014b401:
  local_b0 = local_a0;
  ::std::__cxx11::string::_M_construct((ulong)&local_b0,(char)__len - (char)(num >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)num >> 0x1f) + (long)local_b0),__len,__val);
  uVar9 = 0xf;
  if (local_f0 != local_e0) {
    uVar9 = local_e0[0];
  }
  if (uVar9 < (ulong)(local_a8 + local_e8)) {
    uVar9 = 0xf;
    if (local_b0 != local_a0) {
      uVar9 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_e8) <= uVar9) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0014b494;
    }
  }
  puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_b0);
LAB_0014b494:
  local_d0 = &local_c0;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = puVar4[3];
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (undefined8 *)*puVar4;
  }
  local_c8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_d0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(type->_M_dataplus)._M_p);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_70);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50.field_2._8_8_ = plVar5[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_50._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ArgumentMismatch(__return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch TypedAtLeast(std::string name, int num, std::string type) {
        return ArgumentMismatch(name + ": " + std::to_string(num) + " required " + type + " missing");
    }